

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

ParseStatus ParseAnimationFrame(WebPDemuxer *dmux,uint32_t frame_chunk_size)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int in_ESI;
  WebPDemuxer *in_RDI;
  ParseStatus status;
  size_t start_offset;
  Frame *frame;
  MemBuffer *mem;
  int bits;
  int added_frame;
  uint32_t anmf_payload_size;
  int is_animation;
  MemBuffer *in_stack_00000040;
  uint32_t in_stack_0000004c;
  int in_stack_00000050;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  MemBuffer *in_stack_ffffffffffffffc0;
  size_t sVar4;
  Frame *in_stack_ffffffffffffffc8;
  int local_20;
  ParseStatus local_4;
  
  uVar1 = in_RDI->feature_flags_;
  local_20 = 0;
  local_4 = NewFrame((MemBuffer *)in_stack_ffffffffffffffc8,
                     (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffffc0,
                     (Frame **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (local_4 == PARSE_OK) {
    iVar3 = ReadLE24s(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc8->x_offset_ = iVar3 << 1;
    iVar3 = ReadLE24s(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc8->y_offset_ = iVar3 << 1;
    iVar3 = ReadLE24s(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc8->width_ = iVar3 + 1;
    iVar3 = ReadLE24s(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc8->height_ = iVar3 + 1;
    iVar3 = ReadLE24s(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc8->duration_ = iVar3;
    bVar2 = ReadByte(in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc8->dispose_method_ = (uint)((bVar2 & 1) != 0);
    in_stack_ffffffffffffffc8->blend_method_ = (uint)((bVar2 & 2) != 0);
    if ((ulong)((long)(int)*(size_t *)&in_stack_ffffffffffffffc8->width_ *
               (long)in_stack_ffffffffffffffc8->height_) < 0x100000000) {
      sVar4 = (in_RDI->mem_).start_;
      local_4 = StoreFrame(in_stack_00000050,in_stack_0000004c,in_stack_00000040,(Frame *)dmux);
      if ((local_4 != PARSE_ERROR) && ((ulong)(in_ESI - 0x10) < (in_RDI->mem_).start_ - sVar4)) {
        local_4 = PARSE_ERROR;
      }
      if (((local_4 != PARSE_ERROR) && ((uVar1 & 2) != 0)) &&
         (0 < in_stack_ffffffffffffffc8->frame_num_)) {
        local_20 = AddFrame(in_RDI,in_stack_ffffffffffffffc8);
        if (local_20 == 0) {
          local_4 = PARSE_ERROR;
        }
        else {
          in_RDI->num_frames_ = in_RDI->num_frames_ + 1;
        }
      }
      if (local_20 == 0) {
        WebPSafeFree((void *)0x1097bc);
      }
    }
    else {
      WebPSafeFree((void *)0x1096fd);
      local_4 = PARSE_ERROR;
    }
  }
  return local_4;
}

Assistant:

static ParseStatus ParseAnimationFrame(
    WebPDemuxer* const dmux, uint32_t frame_chunk_size) {
  const int is_animation = !!(dmux->feature_flags_ & ANIMATION_FLAG);
  const uint32_t anmf_payload_size = frame_chunk_size - ANMF_CHUNK_SIZE;
  int added_frame = 0;
  int bits;
  MemBuffer* const mem = &dmux->mem_;
  Frame* frame;
  size_t start_offset;
  ParseStatus status =
      NewFrame(mem, ANMF_CHUNK_SIZE, frame_chunk_size, &frame);
  if (status != PARSE_OK) return status;

  frame->x_offset_       = 2 * ReadLE24s(mem);
  frame->y_offset_       = 2 * ReadLE24s(mem);
  frame->width_          = 1 + ReadLE24s(mem);
  frame->height_         = 1 + ReadLE24s(mem);
  frame->duration_       = ReadLE24s(mem);
  bits = ReadByte(mem);
  frame->dispose_method_ =
      (bits & 1) ? WEBP_MUX_DISPOSE_BACKGROUND : WEBP_MUX_DISPOSE_NONE;
  frame->blend_method_ = (bits & 2) ? WEBP_MUX_NO_BLEND : WEBP_MUX_BLEND;
  if (frame->width_ * (uint64_t)frame->height_ >= MAX_IMAGE_AREA) {
    WebPSafeFree(frame);
    return PARSE_ERROR;
  }

  // Store a frame only if the animation flag is set there is some data for
  // this frame is available.
  start_offset = mem->start_;
  status = StoreFrame(dmux->num_frames_ + 1, anmf_payload_size, mem, frame);
  if (status != PARSE_ERROR && mem->start_ - start_offset > anmf_payload_size) {
    status = PARSE_ERROR;
  }
  if (status != PARSE_ERROR && is_animation && frame->frame_num_ > 0) {
    added_frame = AddFrame(dmux, frame);
    if (added_frame) {
      ++dmux->num_frames_;
    } else {
      status = PARSE_ERROR;
    }
  }

  if (!added_frame) WebPSafeFree(frame);
  return status;
}